

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O3

void mean_int_2_suite::test_ctor(void)

{
  moment<int,_2> filter;
  long local_68;
  int local_5c;
  undefined1 local_58 [8];
  undefined1 *local_50;
  long local_48;
  undefined8 local_40;
  undefined4 local_38;
  
  local_50 = local_58;
  local_48 = 0;
  local_40 = 2;
  local_38 = 0;
  local_68 = 2;
  local_5c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.capacity()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x18d,"void mean_int_2_suite::test_ctor()",&local_68,&local_5c);
  local_5c._0_1_ = 1;
  local_68._0_1_ = local_48 == 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.empty()","true",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x18e,"void mean_int_2_suite::test_ctor()",&local_68,&local_5c);
  local_68 = CONCAT71(local_68._1_7_,local_48 == 2);
  local_5c = (uint)local_5c._1_3_ << 8;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.full()","false",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,399,"void mean_int_2_suite::test_ctor()",&local_68,&local_5c);
  local_68 = local_48;
  local_5c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,400,"void mean_int_2_suite::test_ctor()",&local_68,&local_5c);
  local_68 = CONCAT44(local_68._4_4_,local_38);
  local_5c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("filter.mean()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x191,"void mean_int_2_suite::test_ctor()",&local_68,&local_5c);
  return;
}

Assistant:

void test_ctor()
{
    window::moment<int, 2> filter;
    TRIAL_TEST_EQ(filter.capacity(), 2);
    TRIAL_TEST_EQ(filter.empty(), true);
    TRIAL_TEST_EQ(filter.full(), false);
    TRIAL_TEST_EQ(filter.size(), 0);
    TRIAL_TEST_EQ(filter.mean(), 0);
}